

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O1

map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> * __thiscall
Dice::getLastResolvedHand
          (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *__return_storage_ptr__,Dice *this)

{
  mapped_type mVar1;
  mapped_type *pmVar2;
  initializer_list<std::pair<const_int,_int>_> __l;
  key_type local_60;
  allocator_type local_59;
  pair<const_int,_int> local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 4;
  uStack_30 = 5;
  local_48 = 2;
  uStack_40 = 3;
  local_58.first = 0;
  local_58.second = 0;
  uStack_50 = 1;
  __l._M_len = 6;
  __l._M_array = &local_58;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            (__return_storage_ptr__,__l,(less<int> *)&local_60,&local_59);
  local_58 = (pair<const_int,_int>)((ulong)local_58 & 0xffffffff00000000);
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((this->historyOfResolvedRolls).
                        super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,(key_type *)&local_58);
  mVar1 = *pmVar2;
  local_60 = 0;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_60);
  *pmVar2 = mVar1;
  local_58.first = 1;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((this->historyOfResolvedRolls).
                        super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,(key_type *)&local_58);
  mVar1 = *pmVar2;
  local_60 = 1;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_60);
  *pmVar2 = mVar1;
  local_58.first = 2;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((this->historyOfResolvedRolls).
                        super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,(key_type *)&local_58);
  mVar1 = *pmVar2;
  local_60 = 2;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_60);
  *pmVar2 = mVar1;
  local_58.first = 3;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((this->historyOfResolvedRolls).
                        super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,(key_type *)&local_58);
  mVar1 = *pmVar2;
  local_60 = 3;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_60);
  *pmVar2 = mVar1;
  local_58.first = 4;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((this->historyOfResolvedRolls).
                        super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,(key_type *)&local_58);
  mVar1 = *pmVar2;
  local_60 = 4;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_60);
  *pmVar2 = mVar1;
  local_58.first = 5;
  pmVar2 = std::
           map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>
           ::operator[]((this->historyOfResolvedRolls).
                        super__Vector_base<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>,_std::allocator<std::map<Dice::DiceOptions,_int,_std::less<Dice::DiceOptions>,_std::allocator<std::pair<const_Dice::DiceOptions,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1,(key_type *)&local_58);
  mVar1 = *pmVar2;
  local_60 = 5;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
           operator[](__return_storage_ptr__,&local_60);
  *pmVar2 = mVar1;
  return __return_storage_ptr__;
}

Assistant:

map<int,int> Dice::getLastResolvedHand() {
    // 0= "Energy", 1="Attack", 2="Destruction", 3="Heal", 4="Celebrity", 5="Ouch"
    map<int,int> tempVal = {{0, 0}, {1, 0}, {2, 0}, {3, 0} , {4, 0} , {5, 0}};

    tempVal[0] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Energy];
    tempVal[1] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Attack];
    tempVal[2] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Destruction];
    tempVal[3] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Heal];
    tempVal[4] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Celebrity];
    tempVal[5] = historyOfResolvedRolls[historyOfResolvedRolls.size()-1][DiceOptions::Ouch];

    return tempVal;
}